

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_branch_a(DisasContext_conflict8 *dc,target_ulong pc1)

{
  TCGContext_conflict8 *s;
  target_ulong pc;
  TCGLabel *l;
  target_ulong npc;
  TCGLabel *l1;
  TCGContext_conflict8 *tcg_ctx;
  target_ulong pc1_local;
  DisasContext_conflict8 *dc_local;
  
  s = dc->uc->tcg_ctx;
  l = gen_new_label_sparc64(s);
  pc = dc->npc;
  tcg_gen_brcondi_i64_sparc64(s,TCG_COND_EQ,s->cpu_cond,0,l);
  gen_goto_tb(dc,0,pc,pc1);
  gen_set_label(s,l);
  gen_goto_tb(dc,1,pc + 4,pc + 8);
  (dc->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static void gen_branch_a(DisasContext *dc, target_ulong pc1)
{
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;
    TCGLabel *l1 = gen_new_label(tcg_ctx);
    target_ulong npc = dc->npc;

    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_cond, 0, l1);

    gen_goto_tb(dc, 0, npc, pc1);

    gen_set_label(tcg_ctx, l1);
    gen_goto_tb(dc, 1, npc + 4, npc + 8);

    dc->base.is_jmp = DISAS_NORETURN;
}